

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Option::get_flag_value(Option *this,string *name,string *input_value)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  size_type __n;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n_00;
  int *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  long in_RSI;
  string *in_RDI;
  undefined1 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  string *in_stack_00000010;
  int64_t val;
  ptrdiff_t ind;
  ptrdiff_t default_ind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  allocator<char> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffee8;
  undefined1 local_36;
  undefined1 local_35 [20];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_21;
  
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::trueString_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::trueString_abi_cxx11_), iVar3 != 0)) {
    in_stack_fffffffffffffea8 = &local_21;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90
              );
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         trueString_abi_cxx11_);
  }
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::falseString_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::falseString_abi_cxx11_), iVar3 != 0)) {
    in_stack_fffffffffffffea0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_35;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90
              );
    ::std::allocator<char>::~allocator((allocator<char> *)local_35);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  falseString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         falseString_abi_cxx11_);
  }
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::emptyString_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::emptyString_abi_cxx11_), iVar3 != 0)) {
    in_stack_fffffffffffffe98 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_36;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90
              );
    ::std::allocator<char>::~allocator((allocator<char> *)&local_36);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  emptyString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         emptyString_abi_cxx11_);
  }
  if ((((*(byte *)(in_RSI + 0x24) & 1) != 0) &&
      (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x193e6a),
      !bVar1)) &&
     (_Var2 = ::std::operator==(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78), !_Var2)) {
    ::std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_RCX,in_stack_fffffffffffffea8);
    __n = CLI::detail::find_member
                    (in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr_00,(bool)unaff_retaddr)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffe70);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffe60);
    if ((long)__n < 0) {
      _Var2 = ::std::operator==(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      if (((_Var2 ^ 0xffU) & 1) != 0) {
        uVar4 = __cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        ArgumentMismatch::FlagOverride(in_stack_fffffffffffffe98);
        __cxa_throw(uVar4,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
      }
    }
    else {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(in_RSI + 0x58),__n);
      _Var2 = ::std::operator==(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      if (((_Var2 ^ 0xffU) & 1) != 0) {
        _Var2 = ::std::operator==(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        if ((_Var2) && ((*(byte *)(in_RSI + 0x24e) & 1) != 0)) {
          ::std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          return in_RDI;
        }
        uVar4 = __cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        ArgumentMismatch::FlagOverride(in_stack_fffffffffffffe98);
        __cxa_throw(uVar4,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
      }
    }
  }
  ::std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_RCX,in_stack_fffffffffffffea8);
  __n_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CLI::detail::find_member
                     (in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr_00,(bool)unaff_retaddr
                     );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffe70);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffe60);
  pbVar6 = __n_00;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x194299);
  if ((bVar1) || (_Var2 = ::std::operator==(in_stack_fffffffffffffe80,pbVar6), _Var2)) {
    if ((*(byte *)(in_RSI + 0x24a) & 1) == 0) {
      if (-1 < (long)__n_00) {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(in_RSI + 0x58),(size_type)__n_00);
      }
      ::std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
    else {
      if (-1 < (long)__n_00) {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(in_RSI + 0x58),(size_type)__n_00);
      }
      ::std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
  }
  else if ((long)__n_00 < 0) {
    ::std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  else {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(in_RSI + 0x58),(size_type)__n_00);
    _Var2 = ::std::operator==(in_stack_fffffffffffffe80,pbVar6);
    if (_Var2) {
      piVar5 = __errno_location();
      *piVar5 = 0;
      ::std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CLI::detail::to_flag_value(in_stack_fffffffffffffee8);
      ::std::__cxx11::string::~string(pbVar6);
      piVar5 = __errno_location();
      if (*piVar5 == 0) {
        if (pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1) {
          ::std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        }
        else if (pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0xffffffffffffffff) {
          ::std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        }
        else {
          std::__cxx11::to_string((long)in_stack_fffffffffffffea8);
        }
      }
      else {
        piVar5 = __errno_location();
        *piVar5 = 0;
        ::std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      }
    }
    else {
      ::std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
  }
  return in_RDI;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE std::string Option::get_flag_value(const std::string &name,
                                                                std::string input_value) const {
    static const std::string trueString{"true"};
    static const std::string falseString{"false"};
    static const std::string emptyString{"{}"};
    // check for disable flag override_
    if(disable_flag_override_) {
        if(!((input_value.empty()) || (input_value == emptyString))) {
            auto default_ind = detail::find_member(name, fnames_, ignore_case_, ignore_underscore_);
            if(default_ind >= 0) {
                // We can static cast this to std::size_t because it is more than 0 in this block
                if(default_flag_values_[static_cast<std::size_t>(default_ind)].second != input_value) {
                    if(input_value == default_str_ && force_callback_) {
                        return input_value;
                    }
                    throw(ArgumentMismatch::FlagOverride(name));
                }
            } else {
                if(input_value != trueString) {
                    throw(ArgumentMismatch::FlagOverride(name));
                }
            }
        }
    }
    auto ind = detail::find_member(name, fnames_, ignore_case_, ignore_underscore_);
    if((input_value.empty()) || (input_value == emptyString)) {
        if(flag_like_) {
            return (ind < 0) ? trueString : default_flag_values_[static_cast<std::size_t>(ind)].second;
        }
        return (ind < 0) ? default_str_ : default_flag_values_[static_cast<std::size_t>(ind)].second;
    }
    if(ind < 0) {
        return input_value;
    }
    if(default_flag_values_[static_cast<std::size_t>(ind)].second == falseString) {
        errno = 0;
        auto val = detail::to_flag_value(input_value);
        if(errno != 0) {
            errno = 0;
            return input_value;
        }
        return (val == 1) ? falseString : (val == (-1) ? trueString : std::to_string(-val));
    }
    return input_value;
}